

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::processJumpMemDir(Assembler *this,string *instruction,string *operand)

{
  bool bVar1;
  int value;
  Assembler *this_00;
  Assembler *literal;
  string sStack_88;
  undefined1 local_68 [64];
  
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (operand,&symbolReg_abi_cxx11_,0);
  if (bVar1) {
    literal = (Assembler *)(local_68 + 0x20);
    std::__cxx11::string::string((string *)literal,(string *)operand);
    value = processAbsoluteAddressingSymbol(this,(string *)literal);
  }
  else {
    literal = (Assembler *)local_68;
    this_00 = literal;
    std::__cxx11::string::string((string *)literal,(string *)operand);
    value = literalToDecimal(this_00,(string *)literal);
  }
  std::__cxx11::string::~string((string *)literal);
  std::__cxx11::string::string((string *)&sStack_88,(string *)instruction);
  instr5Bytes(this,&sStack_88,0xff,4,value);
  std::__cxx11::string::~string((string *)&sStack_88);
  return;
}

Assistant:

void Assembler::processJumpMemDir(string instruction, string operand) {
    int reg = 0xFF;
    int adr = 0x04;
    int value;
    if (regex_match(operand, symbolReg)) value = processAbsoluteAddressingSymbol(operand);
    else value = literalToDecimal(operand);

    instr5Bytes(instruction, reg, adr, value);

}